

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall duckdb::Connection::Connection(Connection *this,Connection *other)

{
  warning_callback_t p_Var1;
  connection_t cVar2;
  
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->warning_cb = (warning_callback_t)0x0;
  ::std::swap<duckdb::shared_ptr<duckdb::ClientContext,true>>(&this->context,&other->context);
  p_Var1 = this->warning_cb;
  this->warning_cb = other->warning_cb;
  other->warning_cb = p_Var1;
  cVar2 = this->connection_id;
  this->connection_id = other->connection_id;
  other->connection_id = cVar2;
  return;
}

Assistant:

Connection::Connection(Connection &&other) noexcept : warning_cb(nullptr) {
	std::swap(context, other.context);
	std::swap(warning_cb, other.warning_cb);
	std::swap(connection_id, other.connection_id);
}